

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hud.cpp
# Opt level: O2

void __thiscall CHud::RenderStartCountdown(CHud *this)

{
  long lVar1;
  IGraphics *pIVar2;
  ITextRender *pIVar3;
  CGameClient *pCVar4;
  ulong uVar5;
  int iVar6;
  char *pcVar7;
  long in_FS_OFFSET;
  char aBuf [32];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((((this->super_CComponent).m_pClient)->m_Snap).m_pGameData)->m_GameStateFlags & 0x20) != 0)
  {
    if (RenderStartCountdown()::s_LabelCursor == '\0') {
      iVar6 = __cxa_guard_acquire(&RenderStartCountdown()::s_LabelCursor);
      if (iVar6 != 0) {
        CTextCursor::CTextCursor(&RenderStartCountdown::s_LabelCursor,20.0,0);
        __cxa_atexit(CTextCursor::~CTextCursor,&RenderStartCountdown::s_LabelCursor,&__dso_handle);
        __cxa_guard_release(&RenderStartCountdown()::s_LabelCursor);
      }
    }
    pIVar2 = ((this->super_CComponent).m_pClient)->m_pGraphics;
    RenderStartCountdown::s_LabelCursor.m_CursorPos.field_0.x =
         ((float)pIVar2->m_ScreenWidth / (float)pIVar2->m_ScreenHeight) * 150.0;
    RenderStartCountdown::s_LabelCursor.m_CursorPos.field_1.y = 50.0;
    RenderStartCountdown::s_LabelCursor.m_Align = 1;
    pcVar7 = Localize("Game starts in","");
    CTextCursor::Reset(&RenderStartCountdown::s_LabelCursor,(long)g_Localization.m_CurrentVersion);
    pIVar3 = ((this->super_CComponent).m_pClient)->m_pTextRender;
    (*(pIVar3->super_IInterface)._vptr_IInterface[0xb])
              (pIVar3,&RenderStartCountdown::s_LabelCursor,pcVar7,0xffffffffffffffff);
    if (((((this->super_CComponent).m_pClient)->m_Snap).m_pGameData)->m_GameStateEndTick != 0) {
      if (RenderStartCountdown()::s_Cursor == '\0') {
        iVar6 = __cxa_guard_acquire(&RenderStartCountdown()::s_Cursor);
        if (iVar6 != 0) {
          CTextCursor::CTextCursor(&RenderStartCountdown::s_Cursor,16.0,0);
          __cxa_atexit(CTextCursor::~CTextCursor,&RenderStartCountdown::s_Cursor,&__dso_handle);
          __cxa_guard_release(&RenderStartCountdown()::s_Cursor);
        }
      }
      pIVar2 = ((this->super_CComponent).m_pClient)->m_pGraphics;
      RenderStartCountdown::s_Cursor.m_CursorPos.field_0.x =
           ((float)pIVar2->m_ScreenWidth / (float)pIVar2->m_ScreenHeight) * 150.0;
      RenderStartCountdown::s_Cursor.m_CursorPos.field_1.y = 75.0;
      RenderStartCountdown::s_Cursor.m_Align = 1;
      pCVar4 = (this->super_CComponent).m_pClient;
      uVar5 = (long)((((pCVar4->m_Snap).m_pGameData)->m_GameStateEndTick -
                     pCVar4->m_pClient->m_CurGameTick) + 0x31) / 0x32;
      str_format(aBuf,0x20,"%d",uVar5 & 0xffffffff);
      CTextCursor::Reset(&RenderStartCountdown::s_Cursor,(long)(int)uVar5);
      pIVar3 = ((this->super_CComponent).m_pClient)->m_pTextRender;
      (*(pIVar3->super_IInterface)._vptr_IInterface[0xb])
                (pIVar3,&RenderStartCountdown::s_Cursor,aBuf,0xffffffffffffffff);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CHud::RenderStartCountdown()
{
	if(m_pClient->m_Snap.m_pGameData->m_GameStateFlags&GAMESTATEFLAG_STARTCOUNTDOWN)
	{
		static CTextCursor s_LabelCursor(20.0f);
		s_LabelCursor.MoveTo(150 * Graphics()->ScreenAspect(), 50);
		s_LabelCursor.m_Align = TEXTALIGN_TC;

		const char *pText = Localize("Game starts in");

		s_LabelCursor.Reset(g_Localization.Version());
		TextRender()->TextOutlined(&s_LabelCursor, pText, -1);

		if(m_pClient->m_Snap.m_pGameData->m_GameStateEndTick == 0)
			return;

		static CTextCursor s_Cursor(16.0f);
		s_Cursor.MoveTo(150*Graphics()->ScreenAspect(), 75);
		s_Cursor.m_Align = TEXTALIGN_TC;

		char aBuf[32];
		int Seconds = (m_pClient->m_Snap.m_pGameData->m_GameStateEndTick-Client()->GameTick()+SERVER_TICK_SPEED-1)/SERVER_TICK_SPEED;
		str_format(aBuf, sizeof(aBuf), "%d", Seconds);
		
		s_Cursor.Reset(Seconds);
		TextRender()->TextOutlined(&s_Cursor, aBuf, -1);
	}
}